

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

void __thiscall llm_graph_input_cls::set_input(llm_graph_input_cls *this,llama_ubatch *ubatch)

{
  llama_pooling_type lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  llama_seq_id **pplVar7;
  llama_pos *plVar8;
  void *pvVar9;
  char cVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  vector<int,_std::allocator<int>_> last_row;
  vector<int,_std::allocator<int>_> last_pos;
  allocator_type local_65;
  value_type_conflict3 local_64;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  if ((this->cparams->embeddings == true) &&
     ((lVar1 = this->cparams->pooling_type, lVar1 == LLAMA_POOLING_TYPE_RANK ||
      (lVar1 == LLAMA_POOLING_TYPE_CLS)))) {
    if (this->cls == (ggml_tensor *)0x0) {
      pcVar12 = "cls";
      uVar14 = 0xca;
      goto LAB_001aa9a6;
    }
    uVar2 = ubatch->n_tokens;
    uVar3 = ubatch->n_seq_tokens;
    uVar4 = ubatch->n_seqs;
    cVar10 = ggml_backend_buffer_is_host(this->cls->buffer);
    if (cVar10 == '\0') {
      pcVar12 = "ggml_backend_buffer_is_host(cls->buffer)";
      uVar14 = 0xcb;
      goto LAB_001aa9a6;
    }
    pvVar6 = this->cls->data;
    lVar11 = ggml_element_size();
    memset(pvVar6,0,lVar11 * (ulong)uVar2);
    if ((ulong)uVar4 != 0) {
      pplVar7 = ubatch->seq_id;
      lVar11 = 0;
      uVar13 = 0;
      do {
        iVar5 = *pplVar7[uVar13];
        if ((long)(ulong)uVar2 <= (long)iVar5) {
          pcVar12 = 
          "seq_id < n_tokens && \"seq_id cannot be larger than n_tokens with pooling_type == CLS or RANK\""
          ;
          uVar14 = 0xd4;
          goto LAB_001aa9a6;
        }
        if (uVar3 != 0) {
          plVar8 = ubatch->pos;
          uVar15 = (ulong)uVar3;
          lVar16 = lVar11;
          do {
            if (plVar8[lVar16] == 0) {
              *(int *)((long)pvVar6 + (long)iVar5 * 4) = (int)lVar16;
            }
            lVar16 = lVar16 + 1;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + (ulong)uVar3;
      } while (uVar13 != uVar4);
    }
  }
  if (this->cparams->embeddings != true) {
    return;
  }
  if (this->cparams->pooling_type != LLAMA_POOLING_TYPE_LAST) {
    return;
  }
  if (this->cls == (ggml_tensor *)0x0) {
    pcVar12 = "cls";
    uVar14 = 0xe5;
LAB_001aa9a6:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
               ,uVar14,"GGML_ASSERT(%s) failed",pcVar12);
  }
  uVar13 = (ulong)ubatch->n_tokens;
  uVar2 = ubatch->n_seq_tokens;
  uVar3 = ubatch->n_seqs;
  cVar10 = ggml_backend_buffer_is_host(this->cls->buffer);
  if (cVar10 == '\0') {
    pcVar12 = "ggml_backend_buffer_is_host(cls->buffer)";
    uVar14 = 0xe6;
    goto LAB_001aa9a6;
  }
  pvVar6 = this->cls->data;
  lVar11 = ggml_element_size();
  memset(pvVar6,0,lVar11 * uVar13);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,uVar13,(value_type_conflict3 *)&local_60,(allocator_type *)&local_64);
  local_64 = -1;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,uVar13,&local_64,&local_65);
  if ((ulong)uVar3 != 0) {
    pplVar7 = ubatch->seq_id;
    lVar11 = 0;
    uVar15 = 0;
    do {
      lVar16 = (long)*pplVar7[uVar15];
      if ((long)uVar13 <= lVar16) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0xf2,"GGML_ASSERT(%s) failed",
                   "seq_id < n_tokens && \"seq_id cannot be larger than n_tokens with pooling_type == LAST\""
                  );
      }
      if (uVar2 != 0) {
        plVar8 = ubatch->pos;
        uVar17 = (ulong)uVar2;
        lVar18 = lVar11;
        do {
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar16] <= plVar8[lVar18]) {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar16] = plVar8[lVar18];
            *(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + lVar16 * 4) = (int)lVar18;
          }
          lVar18 = lVar18 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      uVar15 = uVar15 + 1;
      lVar11 = lVar11 + (ulong)uVar2;
    } while (uVar15 != uVar3);
  }
  pvVar9 = (void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (uVar13 == 0) {
    if (pvVar9 == (void *)0x0) goto LAB_001aa966;
  }
  else {
    uVar15 = 0;
    do {
      iVar5 = *(int *)((long)pvVar9 + uVar15 * 4);
      if (-1 < iVar5) {
        *(int *)((long)pvVar6 + uVar15 * 4) = iVar5;
      }
      uVar15 = uVar15 + 1;
    } while (uVar13 != uVar15);
  }
  operator_delete(pvVar9,(long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage - (long)pvVar9);
LAB_001aa966:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void llm_graph_input_cls::set_input(const llama_ubatch * ubatch) {
    if (cparams.embeddings && (
                cparams.pooling_type == LLAMA_POOLING_TYPE_CLS ||
                cparams.pooling_type == LLAMA_POOLING_TYPE_RANK)) {
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        GGML_ASSERT(cls);
        GGML_ASSERT(ggml_backend_buffer_is_host(cls->buffer));

        uint32_t * data = (uint32_t *) cls->data;
        memset(cls->data, 0, n_tokens * ggml_element_size(cls));

        for (int s = 0; s < n_seqs; ++s) {
            const llama_seq_id seq_id = ubatch->seq_id[s][0];

            // TODO: adapt limits to n_seqs when ubatch->equal_seqs is true
            GGML_ASSERT(seq_id < n_tokens && "seq_id cannot be larger than n_tokens with pooling_type == CLS or RANK");

            for (int i = 0; i < n_seq_tokens; ++i) {
                const llama_pos pos = ubatch->pos[s*n_seq_tokens + i];

                if (pos == 0) {
                    data[seq_id] = s*n_seq_tokens + i;
                }
            }
        }
    }

    if (cparams.embeddings && cparams.pooling_type == LLAMA_POOLING_TYPE_LAST) {
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        GGML_ASSERT(cls);
        GGML_ASSERT(ggml_backend_buffer_is_host(cls->buffer));

        uint32_t * data = (uint32_t *) cls->data;
        memset(cls->data, 0, n_tokens * ggml_element_size(cls));

        std::vector<int> last_pos(n_tokens, -1);
        std::vector<int> last_row(n_tokens, -1);

        for (int s = 0; s < n_seqs; ++s) {
            const llama_seq_id seq_id = ubatch->seq_id[s][0];

            // TODO: adapt limits to n_seqs when ubatch->equal_seqs is true
            GGML_ASSERT(seq_id < n_tokens && "seq_id cannot be larger than n_tokens with pooling_type == LAST");

            for (int i = 0; i < n_seq_tokens; ++i) {
                const llama_pos pos = ubatch->pos[s*n_seq_tokens + i];

                if (pos >= last_pos[seq_id]) {
                    last_pos[seq_id] = pos;
                    last_row[seq_id] = s*n_seq_tokens + i;
                }
            }
        }

        for (int i = 0; i < n_tokens; ++i) {
            if (last_row[i] >= 0) {
                data[i] = last_row[i];
            }
        }
    }
}